

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_doing(Curl_easy *data,_Bool *done)

{
  smb_conn_state sVar1;
  curl_socket_t sockfd;
  uint uVar2;
  MQTT *pMVar3;
  char *buf;
  _Bool *p_Var4;
  byte bVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  connectdata *pcVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  connectdata *conn;
  uchar byte;
  ssize_t nread;
  byte local_53;
  byte local_52;
  char local_51;
  size_t local_50;
  curl_socket_t local_44;
  _Bool *local_40;
  connectdata *local_38;
  
  local_38 = data->conn;
  pMVar3 = (data->req).p.mqtt;
  local_44 = local_38->sock[0];
  pcVar10 = (data->state).buffer;
  *done = false;
  if (pMVar3->nsend == 0) {
    CVar6 = CURLE_OK;
  }
  else {
    buf = pMVar3->sendleftovers;
    CVar6 = mqtt_send(data,buf,pMVar3->nsend);
    (*Curl_cfree)(buf);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
  }
  pcVar8 = local_38;
  Curl_infof(data,"mqtt_doing: state [%d]",(ulong)(local_38->proto).smbc.state);
  switch((pcVar8->proto).smbc.state) {
  case SMB_NOT_CONNECTED:
    local_40 = done;
    CVar6 = Curl_read(data,local_44,(char *)&pMVar3->firstbyte,1,(ssize_t *)&local_50);
    if (local_50 == 0) break;
    Curl_debug(data,CURLINFO_HEADER_IN,(char *)&pMVar3->firstbyte,1);
    pMVar3->npacket = 0;
    (data->conn->proto).smbc.state = SMB_CONNECTING;
    done = local_40;
  case SMB_CONNECTING:
    local_40 = done;
    while (CVar7 = Curl_read(data,local_44,(char *)&local_53,1,(ssize_t *)&local_50), local_50 != 0)
    {
      Curl_debug(data,CURLINFO_HEADER_IN,(char *)&local_53,1);
      sVar9 = pMVar3->npacket;
      pMVar3->npacket = sVar9 + 1;
      pcVar10[sVar9] = local_53;
      if ((-1 < (char)local_53) || (3 < pMVar3->npacket)) break;
    }
    p_Var4 = local_40;
    CVar6 = CURLE_WEIRD_SERVER_REPLY;
    if (-1 < (char)local_53) {
      CVar6 = CVar7;
    }
    if (local_50 == 0) {
      CVar6 = CVar7;
    }
    if (CVar6 == CURLE_OK) {
      if (pMVar3->npacket == 0) {
        sVar9 = 0;
      }
      else {
        uVar11 = 1;
        sVar9 = 0;
        lVar12 = 1;
        do {
          bVar5 = pcVar10[uVar11 - 1];
          sVar9 = (ulong)(bVar5 & 0x7f) * lVar12 + sVar9;
          if (pMVar3->npacket <= uVar11) break;
          lVar12 = lVar12 << 7;
          uVar11 = uVar11 + 1;
        } while ((char)bVar5 < '\0');
      }
      pMVar3->remaining_length = sVar9;
      pMVar3->npacket = 0;
      if (sVar9 == 0) {
        (data->conn->proto).ftpc.pp.cache = (char *)0x0;
        CVar6 = CURLE_OK;
        if (pMVar3->firstbyte == 0xe0) {
          CVar6 = CURLE_OK;
          Curl_infof(data,"Got DISCONNECT");
          *p_Var4 = true;
        }
      }
      else {
        sVar1 = (local_38->proto).mqtt.nextstate;
        pcVar8 = data->conn;
        (pcVar8->proto).smbc.state = sVar1;
        CVar6 = CURLE_OK;
        if (sVar1 == SMB_NOT_CONNECTED) {
          (pcVar8->proto).mqtt.nextstate = MQTT_NOSTATE;
        }
      }
    }
    break;
  case SMB_NEGOTIATE:
    CVar6 = Curl_read(data,data->conn->sock[0],(char *)&local_53,2,(ssize_t *)&local_50);
    if (CVar6 == CURLE_OK) {
      Curl_debug(data,CURLINFO_HEADER_IN,(char *)&local_53,local_50);
      CVar6 = CURLE_WEIRD_SERVER_REPLY;
      if (1 < (long)local_50) {
        CVar6 = CURLE_OK;
        if (local_53 != 0 || local_52 != 0) {
          Curl_failf(data,"Expected %02x%02x but got %02x%02x",0,0,(ulong)local_53,(ulong)local_52);
          CVar6 = CURLE_WEIRD_SERVER_REPLY;
        }
      }
    }
    if (CVar6 != CURLE_OK) break;
    if ((data->state).httpreq == HTTPREQ_POST) {
      CVar6 = mqtt_publish(data);
      if (CVar6 == CURLE_OK) {
        CVar6 = mqtt_send(data,anon_var_dwarf_b6ad6,2);
        *done = true;
      }
      (local_38->proto).mqtt.nextstate = MQTT_FIRST;
      break;
    }
    CVar6 = mqtt_subscribe(data);
    if (CVar6 != CURLE_OK) break;
    pcVar8 = data->conn;
    pcVar10 = (char *)0x300000000;
LAB_00131031:
    (pcVar8->proto).ftpc.pp.cache = pcVar10;
    CVar6 = CURLE_OK;
    break;
  case SMB_SETUP:
  case SMB_CONNECTED|SMB_CONNECTING:
  case SMB_CONNECTED|SMB_NEGOTIATE:
    pcVar8 = data->conn;
    sVar1 = (pcVar8->proto).smbc.state;
    CVar6 = CURLE_WEIRD_SERVER_REPLY;
    if (3 < sVar1 - SMB_SETUP) break;
    sockfd = pcVar8->sock[0];
    pcVar10 = (data->state).buffer;
    pMVar3 = (data->req).p.mqtt;
    switch(sVar1) {
    default:
      bVar5 = pMVar3->firstbyte & 0xf0;
      if (bVar5 == 0xe0) {
        CVar6 = CURLE_OK;
        Curl_infof(data,"Got DISCONNECT");
        goto LAB_00131052;
      }
      if (bVar5 == 0x90) {
        (pcVar8->proto).smbc.state = SMB_CONNECTED;
        goto switchD_00130d04_caseD_4;
      }
      if (bVar5 != 0x30) break;
      (pcVar8->proto).smbc.state = SMB_CONNECTED|SMB_NEGOTIATE;
      sVar9 = pMVar3->remaining_length;
      Curl_infof(data,"Remaining length: %zd bytes",sVar9);
      lVar12 = (data->set).max_filesize;
      if (lVar12 != 0 && lVar12 < (long)sVar9) {
        Curl_failf(data,"Maximum file size exceeded");
        CVar6 = CURLE_FILESIZE_EXCEEDED;
        break;
      }
      Curl_pgrsSetDownloadSize(data,sVar9);
      (data->req).bytecount = 0;
      (data->req).size = sVar9;
      pMVar3->npacket = sVar9;
    case SMB_CONNECTED|SMB_NEGOTIATE:
      uVar11 = (data->set).buffer_size;
      if (pMVar3->npacket < uVar11) {
        uVar11 = pMVar3->npacket;
      }
      CVar6 = Curl_read(data,sockfd,pcVar10,uVar11,(ssize_t *)&local_50);
      if (CVar6 == CURLE_OK) {
        if (local_50 == 0) {
          Curl_infof(data,"server disconnected");
          CVar6 = CURLE_PARTIAL_FILE;
        }
        else {
          Curl_debug(data,CURLINFO_DATA_IN,pcVar10,local_50);
          pMVar3->npacket = pMVar3->npacket - local_50;
          lVar12 = local_50 + (data->req).bytecount;
          (data->req).bytecount = lVar12;
          Curl_pgrsSetDownloadCounter(data,lVar12);
          CVar6 = Curl_client_write(data,1,pcVar10,local_50);
          if ((CVar6 == CURLE_OK) && (CVar6 = CURLE_OK, pMVar3->npacket == 0)) {
            (data->conn->proto).ftpc.pp.cache = (char *)0x500000000;
          }
        }
      }
      else if (CVar6 == CURLE_AGAIN) {
        Curl_infof(data,"EEEE AAAAGAIN");
      }
      break;
    case SMB_CONNECTED:
switchD_00130d04_caseD_4:
      CVar6 = Curl_read(data,pcVar8->sock[0],(char *)&local_53,3,(ssize_t *)&local_50);
      if (CVar6 == CURLE_OK) {
        Curl_debug(data,CURLINFO_HEADER_IN,(char *)&local_53,local_50);
        CVar6 = CURLE_WEIRD_SERVER_REPLY;
        if ((2 < (long)local_50) &&
           (((uVar2 = (pcVar8->proto).mqtt.packetid, local_53 != (byte)(uVar2 >> 8) ||
             (local_52 != (byte)uVar2)) || (CVar6 = CURLE_OK, local_51 != '\0')))) {
          CVar6 = CURLE_WEIRD_SERVER_REPLY;
        }
      }
      if (CVar6 != CURLE_OK) break;
      pcVar8 = data->conn;
      pcVar10 = (char *)0x500000000;
      goto LAB_00131031;
    }
    break;
  default:
    Curl_failf(data,"State not handled yet");
LAB_00131052:
    *done = true;
  }
  CVar7 = CURLE_OK;
  if (CVar6 != CURLE_AGAIN) {
    CVar7 = CVar6;
  }
  return CVar7;
}

Assistant:

static CURLcode mqtt_doing(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
  struct MQTT *mq = data->req.p.mqtt;
  ssize_t nread;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  unsigned char *pkt = (unsigned char *)data->state.buffer;
  unsigned char byte;

  *done = FALSE;

  if(mq->nsend) {
    /* send the remainder of an outgoing packet */
    char *ptr = mq->sendleftovers;
    result = mqtt_send(data, mq->sendleftovers, mq->nsend);
    free(ptr);
    if(result)
      return result;
  }

  infof(data, "mqtt_doing: state [%d]", (int) mqtt->state);
  switch(mqtt->state) {
  case MQTT_FIRST:
    /* Read the initial byte only */
    result = Curl_read(data, sockfd, (char *)&mq->firstbyte, 1, &nread);
    if(!nread)
      break;
    Curl_debug(data, CURLINFO_HEADER_IN, (char *)&mq->firstbyte, 1);
    /* remember the first byte */
    mq->npacket = 0;
    mqstate(data, MQTT_REMAINING_LENGTH, MQTT_NOSTATE);
    /* FALLTHROUGH */
  case MQTT_REMAINING_LENGTH:
    do {
      result = Curl_read(data, sockfd, (char *)&byte, 1, &nread);
      if(!nread)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, (char *)&byte, 1);
      pkt[mq->npacket++] = byte;
    } while((byte & 0x80) && (mq->npacket < 4));
    if(nread && (byte & 0x80))
      /* MQTT supports up to 127 * 128^0 + 127 * 128^1 + 127 * 128^2 +
         127 * 128^3 bytes. server tried to send more */
      result = CURLE_WEIRD_SERVER_REPLY;
    if(result)
      break;
    mq->remaining_length = mqtt_decode_len(&pkt[0], mq->npacket, NULL);
    mq->npacket = 0;
    if(mq->remaining_length) {
      mqstate(data, mqtt->nextstate, MQTT_NOSTATE);
      break;
    }
    mqstate(data, MQTT_FIRST, MQTT_FIRST);

    if(mq->firstbyte == MQTT_MSG_DISCONNECT) {
      infof(data, "Got DISCONNECT");
      *done = TRUE;
    }
    break;
  case MQTT_CONNACK:
    result = mqtt_verify_connack(data);
    if(result)
      break;

    if(data->state.httpreq == HTTPREQ_POST) {
      result = mqtt_publish(data);
      if(!result) {
        result = mqtt_disconnect(data);
        *done = TRUE;
      }
      mqtt->nextstate = MQTT_FIRST;
    }
    else {
      result = mqtt_subscribe(data);
      if(!result) {
        mqstate(data, MQTT_FIRST, MQTT_SUBACK);
      }
    }
    break;

  case MQTT_SUBACK:
  case MQTT_PUBWAIT:
  case MQTT_PUB_REMAIN:
    result = mqtt_read_publish(data, done);
    break;

  default:
    failf(data, "State not handled yet");
    *done = TRUE;
    break;
  }

  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  return result;
}